

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_handle_lifetime.cpp
# Opt level: O2

ze_result_t __thiscall
validation_layer::ZEHandleLifetimeValidation::zeEventPoolDestroyPrologue
          (ZEHandleLifetimeValidation *this,ze_event_pool_handle_t hEventPool)

{
  long lVar1;
  bool bVar2;
  
  lVar1 = context;
  if ((hEventPool == (ze_event_pool_handle_t)0x0) ||
     (bVar2 = HandleLifetimeValidation::isHandleValid
                        (*(HandleLifetimeValidation **)(context + 0xd48),hEventPool), !bVar2)) {
    bVar2 = HandleLifetimeValidation::isHandleValid
                      (*(HandleLifetimeValidation **)(lVar1 + 0xd48),hEventPool);
    if (!bVar2) {
      return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
    }
  }
  else {
    bVar2 = HandleLifetimeValidation::hasDependents
                      (*(HandleLifetimeValidation **)(lVar1 + 0xd48),hEventPool);
    if (bVar2) {
      return ZE_RESULT_ERROR_HANDLE_OBJECT_IN_USE;
    }
    HandleLifetimeValidation::removeDependent
              (*(HandleLifetimeValidation **)(lVar1 + 0xd48),hEventPool);
    HandleLifetimeValidation::removeHandle(*(HandleLifetimeValidation **)(lVar1 + 0xd48),hEventPool)
    ;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

ze_result_t
    ZEHandleLifetimeValidation::zeEventPoolDestroyPrologue(
        ze_event_pool_handle_t hEventPool               ///< [in][release] handle of event pool object to destroy
        )
    { 
        
        if (hEventPool && context.handleLifetime->isHandleValid( hEventPool )){
            if (context.handleLifetime->hasDependents( hEventPool )){
                return ZE_RESULT_ERROR_HANDLE_OBJECT_IN_USE;
            }
            context.handleLifetime->removeDependent( hEventPool);
            context.handleLifetime->removeHandle( hEventPool );
        } else if (!context.handleLifetime->isHandleValid( hEventPool )) {
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        return ZE_RESULT_SUCCESS;
    }